

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

U32 ZSTD_btGetAllMatches_extDict_4
              (ZSTD_match_t *matches,ZSTD_matchState_t *ms,U32 *nextToUpdate3,BYTE *ip,
              BYTE *iHighLimit,U32 *rep,U32 ll0,U32 lengthToBeat)

{
  ulong *puVar1;
  ulong *puVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  U32 UVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  size_t sVar12;
  BYTE *pBVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong *puVar17;
  U32 *pUVar18;
  uint uVar19;
  ulong *puVar20;
  U32 UVar21;
  uint uVar22;
  ulong *puVar23;
  uint uVar24;
  BYTE *pBVar25;
  uint uVar26;
  BYTE *pBVar27;
  BYTE *__s1;
  uint uVar28;
  ulong uVar29;
  uint uVar30;
  bool bVar31;
  BYTE *pInLoopLimit;
  uint local_114;
  BYTE *local_100;
  BYTE *local_f8;
  BYTE *local_f0;
  U32 *local_d8;
  U32 *local_d0;
  U32 local_94;
  ulong *local_90;
  ulong *local_88;
  BYTE *local_80;
  BYTE *local_78;
  BYTE *local_70;
  BYTE *local_68;
  ZSTD_match_t *local_60;
  ZSTD_matchState_t *local_58;
  U32 *local_50;
  ulong local_48;
  ulong *local_40;
  U32 *local_38;
  
  local_60 = matches;
  if ((ms->cParams).minMatch != 4) {
    __assert_fail("BOUNDED(3, ms->cParams.minMatch, 6) == mls",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8263,
                  "U32 ZSTD_btGetAllMatches_internal(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *, const BYTE *const, const U32 *, const U32, const U32, const ZSTD_dictMode_e, const U32)"
                 );
  }
  pBVar27 = (ms->window).base;
  uVar29 = (ulong)ms->nextToUpdate;
  UVar7 = 0;
  if (pBVar27 + uVar29 <= ip) {
    while( true ) {
      uVar28 = (uint)uVar29;
      uVar26 = (uint)((long)ip - (long)pBVar27);
      if (uVar26 <= uVar28) break;
      UVar7 = ZSTD_insertBt1(ms,pBVar27 + uVar29,iHighLimit,uVar26,4,1);
      uVar29 = (ulong)(UVar7 + uVar28);
      if (UVar7 + uVar28 <= uVar28) {
        __assert_fail("idx < (U32)(idx + forward)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x815a,
                      "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                     );
      }
    }
    if ((ulong)((long)ip - (long)pBVar27) >> 0x20 != 0) {
      __assert_fail("(size_t)(ip - base) <= (size_t)(U32)(-1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x815d,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
    if ((ulong)((long)iHighLimit - (long)pBVar27) >> 0x20 != 0) {
      __assert_fail("(size_t)(iend - base) <= (size_t)(U32)(-1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x815e,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
    ms->nextToUpdate = uVar26;
    uVar26 = (ms->cParams).targetLength;
    uVar28 = 0xfff;
    if (uVar26 < 0xfff) {
      uVar28 = uVar26;
    }
    uVar26 = (ms->cParams).hashLog;
    if (0x20 < uVar26) {
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
    local_48 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-(char)uVar26 & 0x1fU));
    local_80 = (ms->window).base;
    uVar30 = (int)ip - (int)local_80;
    uVar24 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
    uVar26 = 0;
    uVar8 = uVar30 - uVar24;
    if (uVar30 < uVar24) {
      uVar8 = 0;
    }
    uVar9 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    UVar7 = (ms->window).lowLimit;
    UVar21 = uVar30 - uVar9;
    if (uVar30 - UVar7 <= uVar9) {
      UVar21 = UVar7;
    }
    if (ms->loadedDictEnd != 0) {
      UVar21 = UVar7;
    }
    uVar15 = UVar21 + (UVar21 == 0);
    uVar9 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
    if (1 < ll0) {
      __assert_fail("ll0 <= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x819e,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    local_50 = ms->hashTable;
    uVar22 = local_50[local_48];
    local_38 = ms->chainTable;
    local_68 = (ms->window).dictBase;
    uVar3 = (ms->window).dictLimit;
    pBVar27 = (BYTE *)(ulong)uVar3;
    local_70 = local_68 + (long)pBVar27;
    local_78 = local_80 + (long)pBVar27;
    uVar29 = (ulong)((uVar24 & uVar30) * 2);
    local_d8 = local_38 + uVar29;
    local_d0 = local_38 + uVar29 + 1;
    local_114 = uVar30 + 9;
    local_f8 = (BYTE *)(ulong)(lengthToBeat - 1);
    puVar1 = (ulong *)(ip + 4);
    bVar31 = true;
    puVar2 = (ulong *)(iHighLimit + -7);
    local_40 = (ulong *)(ip + 0xc);
    local_88 = (ulong *)(iHighLimit + -3);
    local_90 = (ulong *)(iHighLimit + -1);
    uVar29 = (ulong)ll0;
    local_58 = ms;
    do {
      if (uVar29 == 3) {
        uVar16 = *rep - 1;
      }
      else {
        uVar16 = rep[uVar29];
      }
      if (uVar30 < uVar3) {
        __assert_fail("curr >= dictLimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x81a5,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      uVar19 = uVar30 - uVar16;
      if (uVar16 - 1 < uVar30 - uVar3) {
        pBVar13 = (BYTE *)0x0;
        if ((UVar21 <= uVar19) && (*(int *)ip == *(int *)(ip + -(ulong)uVar16))) {
          puVar17 = (ulong *)((long)puVar1 - (ulong)uVar16);
          puVar20 = puVar1;
          if (puVar1 < puVar2) {
            uVar11 = *puVar1 ^ *puVar17;
            uVar14 = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
              }
            }
            uVar14 = uVar14 >> 3 & 0x1fffffff;
            iVar10 = (int)uVar14;
            puVar20 = local_40;
            if (*puVar17 == *puVar1) {
              do {
                puVar17 = puVar17 + 1;
                if (puVar2 <= puVar20) goto LAB_001bb298;
                uVar11 = *puVar17;
                uVar4 = *puVar20;
                uVar5 = 0;
                if ((uVar4 ^ uVar11) != 0) {
                  for (; ((uVar4 ^ uVar11) >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                  }
                }
                puVar23 = (ulong *)((uVar5 >> 3 & 0x1fffffff) + (long)puVar20);
                puVar20 = puVar20 + 1;
                if (uVar11 != uVar4) {
                  uVar14 = (long)puVar23 - (long)puVar1;
                  puVar20 = puVar23;
                }
                iVar10 = (int)uVar14;
              } while (uVar11 == uVar4);
            }
          }
          else {
LAB_001bb298:
            if ((puVar20 < local_88) && ((int)*puVar17 == (int)*puVar20)) {
              puVar20 = (ulong *)((long)puVar20 + 4);
              puVar17 = (ulong *)((long)puVar17 + 4);
            }
            if ((puVar20 < local_90) && ((short)*puVar17 == (short)*puVar20)) {
              puVar20 = (ulong *)((long)puVar20 + 2);
              puVar17 = (ulong *)((long)puVar17 + 2);
            }
            if (puVar20 < iHighLimit) {
              puVar20 = (ulong *)((long)puVar20 + (ulong)((BYTE)*puVar17 == (BYTE)*puVar20));
            }
            iVar10 = (int)puVar20 - (int)puVar1;
          }
          pBVar13 = (BYTE *)(ulong)(iVar10 + 4);
        }
      }
      else {
        if (uVar30 < UVar21) {
          __assert_fail("curr >= windowLow",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x81b1,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
        pBVar13 = (BYTE *)0x0;
        if (((uVar16 - 1 < uVar30 - UVar21) && (uVar19 - uVar3 < 0xfffffffd)) &&
           (*(int *)ip == *(int *)(local_68 + uVar19))) {
          sVar12 = ZSTD_count_2segments
                             ((BYTE *)puVar1,(BYTE *)((long)(local_68 + uVar19) + 4),iHighLimit,
                              local_70,local_78);
          pBVar13 = (BYTE *)(ulong)((int)sVar12 + 4);
        }
      }
      uVar16 = (uint)pBVar13;
      bVar6 = true;
      if (local_f8 < pBVar13) {
        local_60[uVar26].off = ((int)uVar29 - ll0) + 1;
        UVar7 = uVar26 + 1;
        local_60[uVar26].len = uVar16;
        bVar6 = ip + (long)pBVar13 != iHighLimit && uVar16 <= uVar28;
        local_f8 = pBVar13;
        uVar26 = UVar7;
        if (ip + (long)pBVar13 == iHighLimit || uVar16 > uVar28) {
          local_100._0_4_ = UVar7;
        }
      }
      if (!bVar6) break;
      uVar29 = uVar29 + 1;
      bVar31 = uVar29 < ll0 + 3;
    } while (uVar29 != ll0 + 3);
    UVar7 = (U32)local_100;
    if (!bVar31) {
      local_50[local_48] = uVar30;
      if (uVar15 <= uVar22) {
        local_f0 = (BYTE *)0x0;
        local_100 = (BYTE *)0x0;
        do {
          pBVar13 = local_100;
          if (local_f0 < local_100) {
            pBVar13 = local_f0;
          }
          if (uVar30 <= uVar22) {
            __assert_fail("curr > matchIndex",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x81f1,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          if (pBVar13 + uVar22 < pBVar27) {
            pBVar25 = local_68 + uVar22;
            iVar10 = bcmp(pBVar25,ip,(size_t)pBVar13);
            if (iVar10 != 0) {
              __assert_fail("memcmp(match, ip, matchLength) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x81fa,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            sVar12 = ZSTD_count_2segments
                               (ip + (long)pBVar13,pBVar25 + (long)pBVar13,iHighLimit,local_70,
                                local_78);
            pBVar13 = pBVar13 + sVar12;
            __s1 = local_80 + uVar22;
            if (pBVar13 + uVar22 < pBVar27) {
              __s1 = pBVar25;
            }
          }
          else {
            __s1 = local_80 + uVar22;
            if ((uVar3 <= uVar22) && (iVar10 = bcmp(__s1,ip,(size_t)pBVar13), iVar10 != 0)) {
              __assert_fail("memcmp(match, ip, matchLength) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x81f6,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            puVar1 = (ulong *)(ip + (long)pBVar13);
            puVar20 = (ulong *)(__s1 + (long)pBVar13);
            puVar17 = puVar1;
            if (puVar1 < puVar2) {
              uVar14 = *puVar1 ^ *puVar20;
              uVar29 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                }
              }
              pBVar25 = (BYTE *)(uVar29 >> 3 & 0x1fffffff);
              if (*puVar20 == *puVar1) {
                do {
                  puVar17 = puVar17 + 1;
                  puVar20 = puVar20 + 1;
                  if (puVar2 <= puVar17) goto LAB_001bb569;
                  uVar14 = *puVar17 ^ *puVar20;
                  uVar29 = 0;
                  if (uVar14 != 0) {
                    for (; (uVar14 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                    }
                  }
                  pBVar25 = (BYTE *)((long)puVar17 + ((uVar29 >> 3 & 0x1fffffff) - (long)puVar1));
                } while (*puVar20 == *puVar17);
              }
            }
            else {
LAB_001bb569:
              if ((puVar17 < local_88) && ((int)*puVar20 == (int)*puVar17)) {
                puVar17 = (ulong *)((long)puVar17 + 4);
                puVar20 = (ulong *)((long)puVar20 + 4);
              }
              if ((puVar17 < local_90) && ((short)*puVar20 == (short)*puVar17)) {
                puVar17 = (ulong *)((long)puVar17 + 2);
                puVar20 = (ulong *)((long)puVar20 + 2);
              }
              if (puVar17 < iHighLimit) {
                puVar17 = (ulong *)((long)puVar17 + (ulong)((BYTE)*puVar20 == (BYTE)*puVar17));
              }
              pBVar25 = (BYTE *)((long)puVar17 - (long)puVar1);
            }
            pBVar13 = pBVar25 + (long)pBVar13;
          }
          if (local_f8 < pBVar13) {
            if (local_114 < uVar22 || local_114 - uVar22 == 0) {
              __assert_fail("matchEndIdx > matchIndex",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x8203,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            if (uVar22 == uVar30) {
              __assert_fail("(curr - matchIndex)>0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x8207,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            if ((BYTE *)(ulong)(local_114 - uVar22) < pBVar13) {
              local_114 = uVar22 + (U32)pBVar13;
            }
            local_60[uVar26].off = (uVar30 + 3) - uVar22;
            local_60[uVar26].len = (U32)pBVar13;
            uVar26 = uVar26 + 1;
            local_f8 = pBVar13;
            if (ip + (long)pBVar13 != iHighLimit && pBVar13 < (BYTE *)0x1001) goto LAB_001bb641;
            bVar31 = false;
          }
          else {
LAB_001bb641:
            pUVar18 = local_38 + (uVar22 & uVar24) * 2;
            if (__s1[(long)pBVar13] < ip[(long)pBVar13]) {
              *local_d8 = uVar22;
              local_f0 = pBVar13;
              if (uVar8 < uVar22) {
                pUVar18 = pUVar18 + 1;
                local_d8 = pUVar18;
LAB_001bb69f:
                uVar22 = *pUVar18;
                bVar31 = true;
              }
              else {
                bVar31 = false;
                local_d8 = &local_94;
              }
            }
            else {
              *local_d0 = uVar22;
              local_100 = pBVar13;
              local_d0 = pUVar18;
              if (uVar8 < uVar22) goto LAB_001bb69f;
              bVar31 = false;
              local_d0 = &local_94;
            }
          }
        } while (((bVar31) && (uVar9 = uVar9 - 1, uVar9 != 0)) && (uVar15 <= uVar22));
      }
      *local_d0 = 0;
      *local_d8 = 0;
      if (0x40000000 < uVar9) {
        __assert_fail("nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8221,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      if (local_114 <= uVar30 + 8) {
        __assert_fail("matchEndIdx > curr+8",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8248,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      local_58->nextToUpdate = local_114 - 8;
      UVar7 = uVar26;
    }
  }
  return UVar7;
}

Assistant:

GEN_ZSTD_BT_GET_ALL_MATCHES(noDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(extDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(dictMatchState)

#define ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMode)  \
    {                                            \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 3), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 4), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 5), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 6)  \
    }

static ZSTD_getAllMatchesFn
ZSTD_selectBtGetAllMatches(ZSTD_matchState_t const* ms, ZSTD_dictMode_e const dictMode)
{
    ZSTD_getAllMatchesFn const getAllMatchesFns[3][4] = {
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(noDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(extDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMatchState)
    };
    U32 const mls = BOUNDED(3, ms->cParams.minMatch, 6);
    assert((U32)dictMode < 3);
    assert(mls - 3 < 4);
    return getAllMatchesFns[(int)dictMode][mls - 3];
}

/*************************
*  LDM helper functions  *
*************************/

/* Struct containing info needed to make decision about ldm inclusion */
typedef struct {
    rawSeqStore_t seqStore;   /* External match candidates store for this block */
    U32 startPosInBlock;      /* Start position of the current match candidate */
    U32 endPosInBlock;        /* End position of the current match candidate */
    U32 offset;               /* Offset of the match candidate */
} ZSTD_optLdm_t;

/* ZSTD_optLdm_skipRawSeqStoreBytes():
 * Moves forward in @rawSeqStore by @nbBytes,
 * which will update the fields 'pos' and 'posInSequence'.
 */
static void ZSTD_optLdm_skipRawSeqStoreBytes(rawSeqStore_t* rawSeqStore, size_t nbBytes)
{
    U32 currPos = (U32)(rawSeqStore->posInSequence + nbBytes);
    while (currPos && rawSeqStore->pos < rawSeqStore->size) {
        rawSeq currSeq = rawSeqStore->seq[rawSeqStore->pos];
        if (currPos >= currSeq.litLength + currSeq.matchLength) {
            currPos -= currSeq.litLength + currSeq.matchLength;
            rawSeqStore->pos++;
        } else {
            rawSeqStore->posInSequence = currPos;
            break;
        }
    }
    if (currPos == 0 || rawSeqStore->pos == rawSeqStore->size) {
        rawSeqStore->posInSequence = 0;
    }
}